

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# navigationbar.cpp
# Opt level: O0

int __thiscall
QtMWidgets::NavigationBar::addWidget
          (NavigationBar *this,QWidget *parent,QString *title,QWidget *widget)

{
  QWidget *pQVar1;
  bool bVar2;
  NavigationBarPrivate *pNVar3;
  QSharedPointer<QtMWidgets::NavigationItem> *pQVar4;
  NavigationItem *pNVar5;
  NavigationItem *pNVar6;
  undefined1 local_50 [8];
  QSharedPointer<QtMWidgets::NavigationItem> item;
  QSharedPointer<QtMWidgets::NavigationItem> pp;
  QWidget *pQStack_28;
  int index;
  QWidget *widget_local;
  QString *title_local;
  QWidget *parent_local;
  NavigationBar *this_local;
  
  pp.d._4_4_ = -1;
  pQStack_28 = widget;
  widget_local = (QWidget *)title;
  title_local = (QString *)parent;
  parent_local = &this->super_QWidget;
  pNVar3 = QScopedPointer<QtMWidgets::NavigationBarPrivate,_QScopedPointerDeleter<QtMWidgets::NavigationBarPrivate>_>
           ::operator->(&this->d);
  bVar2 = QMap<QWidget_*,_QSharedPointer<QtMWidgets::NavigationItem>_>::contains
                    (&pNVar3->itemsMap,(QWidget **)&title_local);
  if (bVar2) {
    pNVar3 = QScopedPointer<QtMWidgets::NavigationBarPrivate,_QScopedPointerDeleter<QtMWidgets::NavigationBarPrivate>_>
             ::operator->(&this->d);
    pp.d._4_4_ = QStackedWidget::addWidget((QWidget *)pNVar3->stack);
    pNVar3 = QScopedPointer<QtMWidgets::NavigationBarPrivate,_QScopedPointerDeleter<QtMWidgets::NavigationBarPrivate>_>
             ::operator->(&this->d);
    pQVar4 = QMap<QWidget_*,_QSharedPointer<QtMWidgets::NavigationItem>_>::operator[]
                       (&pNVar3->itemsMap,(QWidget **)&title_local);
    QSharedPointer<QtMWidgets::NavigationItem>::QSharedPointer
              ((QSharedPointer<QtMWidgets::NavigationItem> *)&item.d,pQVar4);
    pNVar5 = (NavigationItem *)operator_new(0x40);
    NavigationItem::NavigationItem(pNVar5);
    QSharedPointer<QtMWidgets::NavigationItem>::QSharedPointer<QtMWidgets::NavigationItem,_true>
              ((QSharedPointer<QtMWidgets::NavigationItem> *)local_50,pNVar5);
    pQVar1 = widget_local;
    pNVar5 = QSharedPointer<QtMWidgets::NavigationItem>::operator->
                       ((QSharedPointer<QtMWidgets::NavigationItem> *)local_50);
    QString::operator=(&pNVar5->title,(QString *)pQVar1);
    pNVar5 = QSharedPointer<QtMWidgets::NavigationItem>::data
                       ((QSharedPointer<QtMWidgets::NavigationItem> *)&item.d);
    pNVar6 = QSharedPointer<QtMWidgets::NavigationItem>::operator->
                       ((QSharedPointer<QtMWidgets::NavigationItem> *)local_50);
    pQVar1 = pQStack_28;
    pNVar6->parent = pNVar5;
    pNVar5 = QSharedPointer<QtMWidgets::NavigationItem>::operator->
                       ((QSharedPointer<QtMWidgets::NavigationItem> *)local_50);
    pNVar5->self = pQVar1;
    pNVar5 = QSharedPointer<QtMWidgets::NavigationItem>::operator->
                       ((QSharedPointer<QtMWidgets::NavigationItem> *)&item.d);
    QList<QSharedPointer<QtMWidgets::NavigationItem>_>::append
              (&pNVar5->children,(QSharedPointer<QtMWidgets::NavigationItem> *)local_50);
    pNVar3 = QScopedPointer<QtMWidgets::NavigationBarPrivate,_QScopedPointerDeleter<QtMWidgets::NavigationBarPrivate>_>
             ::operator->(&this->d);
    pQVar4 = QMap<QWidget_*,_QSharedPointer<QtMWidgets::NavigationItem>_>::operator[]
                       (&pNVar3->itemsMap,&stack0xffffffffffffffd8);
    QSharedPointer<QtMWidgets::NavigationItem>::operator=
              (pQVar4,(QSharedPointer<QtMWidgets::NavigationItem> *)local_50);
    QSharedPointer<QtMWidgets::NavigationItem>::~QSharedPointer
              ((QSharedPointer<QtMWidgets::NavigationItem> *)local_50);
    QSharedPointer<QtMWidgets::NavigationItem>::~QSharedPointer
              ((QSharedPointer<QtMWidgets::NavigationItem> *)&item.d);
  }
  return pp.d._4_4_;
}

Assistant:

int
NavigationBar::addWidget( QWidget * parent, const QString & title,
	QWidget * widget )
{
	int index = -1;

	if( d->itemsMap.contains( parent ) )
	{
		index = d->stack->addWidget( widget );

		QSharedPointer< NavigationItem > pp = d->itemsMap[ parent ];

		QSharedPointer< NavigationItem > item( new NavigationItem );
		item->title = title;
		item->parent = pp.data();
		item->self = widget;

		pp->children.append( item );
		d->itemsMap[ widget ] = item;
	}

	return index;
}